

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedPipelinePreVS::Run(AdvancedPipelinePreVS *this)

{
  bool bVar1;
  GLuint GVar2;
  int iVar3;
  int height;
  byte local_185;
  Vector<float,_3> local_144;
  undefined1 local_138 [8];
  float data [32];
  string local_b0;
  allocator<char> local_89;
  string local_88;
  char *local_68;
  char *glsl_fs;
  char *glsl_vs;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  AdvancedPipelinePreVS *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 4) in;\nstruct Vertex {\n  vec4 position;\n  vec4 color;\n};\nlayout(binding = 0, std430) buffer VertexBuffer {\n  Vertex g_vertex[];\n};\nuniform float g_scale = 0.8;\nvoid main() {\n  g_vertex[gl_GlobalInvocationID.x].position.xyz *= g_scale;\n  g_vertex[gl_GlobalInvocationID.x].color *= vec4(0, 1, 0, 1);\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 4) in;\nstruct Vertex {\n  vec4 position;\n  vec4 color;\n};\nlayout(binding = 0, std430) buffer VertexBuffer {\n  Vertex g_vertex[];\n};\nuniform float g_scale = 0.8;\nvoid main() {\n  g_vertex[gl_GlobalInvocationID.x].position.xyz *= g_scale;\n  g_vertex[gl_GlobalInvocationID.x].color *= vec4(0, 1, 0, 1);\n}"
             ,&local_41);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_40);
  this->m_program[0] = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program[0]);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program[0],(bool *)0x0);
  if (bVar1) {
    glsl_fs = 
    "\nlayout(location = 0) in vec4 g_position;\nlayout(location = 1) in vec4 g_color;\nout StageData {\n  vec4 color;\n} g_vs_out;\nvoid main() {\n  gl_Position = g_position;\n  g_vs_out.color = g_color;\n}"
    ;
    local_68 = 
    "\nin StageData {\n  vec4 color;\n} g_fs_in;\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = g_fs_in.color;\n}"
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,
               "\nlayout(location = 0) in vec4 g_position;\nlayout(location = 1) in vec4 g_color;\nout StageData {\n  vec4 color;\n} g_vs_out;\nvoid main() {\n  gl_Position = g_position;\n  g_vs_out.color = g_color;\n}"
               ,&local_89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,
               "\nin StageData {\n  vec4 color;\n} g_fs_in;\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = g_fs_in.color;\n}"
               ,(allocator<char> *)((long)data + 0x7f));
    GVar2 = ComputeShaderBase::CreateProgram(&this->super_ComputeShaderBase,&local_88,&local_b0);
    this->m_program[1] = GVar2;
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)data + 0x7f));
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program[1]);
    bVar1 = ComputeShaderBase::CheckProgram
                      (&this->super_ComputeShaderBase,this->m_program[1],(bool *)0x0);
    if (bVar1) {
      memcpy(local_138,&DAT_029fb020,0x80);
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_buffer);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,0x80,local_138,0x88e4);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,0);
      glu::CallLogWrapper::glGenVertexArrays
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glVertexAttribPointer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,4,0x1406,'\0',0x20,(void *)0x0);
      glu::CallLogWrapper::glVertexAttribPointer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,4,0x1406,'\0',0x20,(void *)0x10);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,0);
      glu::CallLogWrapper::glEnableVertexAttribArray
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
      glu::CallLogWrapper::glEnableVertexAttribArray
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,this->m_vertex_buffer);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program[0]);
      glu::CallLogWrapper::glDispatchCompute
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,1,1);
      glu::CallLogWrapper::glClear
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x4000);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program[1]);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1);
      glu::CallLogWrapper::glDrawArraysInstanced
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,5,0,4,1);
      iVar3 = ComputeShaderBase::getWindowWidth(&this->super_ComputeShaderBase);
      local_185 = 0;
      if (iVar3 < 500) {
        iVar3 = ComputeShaderBase::getWindowWidth(&this->super_ComputeShaderBase);
        height = ComputeShaderBase::getWindowHeight(&this->super_ComputeShaderBase);
        tcu::Vector<float,_3>::Vector(&local_144,0.0,1.0,0.0);
        bVar1 = ComputeShaderBase::ValidateReadBufferCenteredQuad
                          (&this->super_ComputeShaderBase,iVar3,height,&local_144);
        local_185 = bVar1 ^ 0xff;
      }
      if ((local_185 & 1) == 0) {
        this_local = (AdvancedPipelinePreVS *)0x0;
      }
      else {
        this_local = (AdvancedPipelinePreVS *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (AdvancedPipelinePreVS *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedPipelinePreVS *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 4) in;" NL "struct Vertex {" NL "  vec4 position;" NL "  vec4 color;" NL "};" NL
			   "layout(binding = 0, std430) buffer VertexBuffer {" NL "  Vertex g_vertex[];" NL "};" NL
			   "uniform float g_scale = 0.8;" NL "void main() {" NL
			   "  g_vertex[gl_GlobalInvocationID.x].position.xyz *= g_scale;" NL
			   "  g_vertex[gl_GlobalInvocationID.x].color *= vec4(0, 1, 0, 1);" NL "}";
		m_program[0] = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program[0]);
		if (!CheckProgram(m_program[0]))
			return ERROR;

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 g_position;" NL "layout(location = 1) in vec4 g_color;" NL
			   "out StageData {" NL "  vec4 color;" NL "} g_vs_out;" NL "void main() {" NL
			   "  gl_Position = g_position;" NL "  g_vs_out.color = g_color;" NL "}";

		const char* const glsl_fs =
			NL "in StageData {" NL "  vec4 color;" NL "} g_fs_in;" NL "layout(location = 0) out vec4 g_color;" NL
			   "void main() {" NL "  g_color = g_fs_in.color;" NL "}";
		m_program[1] = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program[1]);
		if (!CheckProgram(m_program[1]))
			return ERROR;

		/* vertex buffer */
		{
			const float data[] = { -1, -1, 0, 1, 1, 1, 1, 1, 1, -1, 0, 1, 1, 1, 1, 1,
								   -1, 1,  0, 1, 1, 1, 1, 1, 1, 1,  0, 1, 1, 1, 1, 1 };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 2 * sizeof(vec4), 0);
		glVertexAttribPointer(1, 4, GL_FLOAT, GL_FALSE, 2 * sizeof(vec4), reinterpret_cast<void*>(sizeof(vec4)));
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glBindVertexArray(0);

		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_vertex_buffer);
		glUseProgram(m_program[0]);
		glDispatchCompute(1, 1, 1);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program[1]);
		glBindVertexArray(m_vertex_array);
		glMemoryBarrier(GL_VERTEX_ATTRIB_ARRAY_BARRIER_BIT);
		glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 1);

		if (getWindowWidth() < 500 &&
			!ValidateReadBufferCenteredQuad(getWindowWidth(), getWindowHeight(), vec3(0, 1, 0)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}